

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int viewCallback(void *NotUsed,int argc,char **argv,char **azColName)

{
  char **ppcVar1;
  size_t sVar2;
  char *__format;
  int iVar3;
  char tmp_str [64];
  char local_78 [72];
  
  local_78[0x30] = '\0';
  local_78[0x31] = '\0';
  local_78[0x32] = '\0';
  local_78[0x33] = '\0';
  local_78[0x34] = '\0';
  local_78[0x35] = '\0';
  local_78[0x36] = '\0';
  local_78[0x37] = '\0';
  local_78[0x38] = '\0';
  local_78[0x39] = '\0';
  local_78[0x3a] = '\0';
  local_78[0x3b] = '\0';
  local_78[0x3c] = '\0';
  local_78[0x3d] = '\0';
  local_78[0x3e] = '\0';
  local_78[0x3f] = '\0';
  local_78[0x20] = '\0';
  local_78[0x21] = '\0';
  local_78[0x22] = '\0';
  local_78[0x23] = '\0';
  local_78[0x24] = '\0';
  local_78[0x25] = '\0';
  local_78[0x26] = '\0';
  local_78[0x27] = '\0';
  local_78[0x28] = '\0';
  local_78[0x29] = '\0';
  local_78[0x2a] = '\0';
  local_78[0x2b] = '\0';
  local_78[0x2c] = '\0';
  local_78[0x2d] = '\0';
  local_78[0x2e] = '\0';
  local_78[0x2f] = '\0';
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  if (0 < argc) {
    iVar3 = 0;
    do {
      __format = "%s   ";
      ppcVar1 = argv;
      if (iVar3 == 0) {
LAB_0010451e:
        snprintf(local_78,0x40,__format,*ppcVar1);
      }
      else {
        if (iVar3 == 2) {
          __format = "%s";
          ppcVar1 = argv + 2;
          goto LAB_0010451e;
        }
        if (iVar3 == 1) {
          __format = "%s     ";
          ppcVar1 = argv + 1;
          goto LAB_0010451e;
        }
      }
      strcat(query_result_g,local_78);
      iVar3 = iVar3 + 1;
    } while (argc != iVar3);
  }
  sVar2 = strlen(query_result_g);
  (query_result_g + sVar2)[0] = '\n';
  (query_result_g + sVar2)[1] = '\0';
  return 0;
}

Assistant:

int 
viewCallback (void* NotUsed, int argc, char** argv, char** azColName) 
{
    /*  Format of returned string:
     *  18/06/2020, room 21, reserve code: 8GT4A
     */


    // query_result_g is the payload "to be returned". 
    // query_result_g is a global variable!

    // clean payload right before filling if from scratch.
    // memset(query_result_g, '\0', sizeof(query_result_g));

    
    char tmp_str[64];
    memset(tmp_str, '\0', sizeof(tmp_str));


    for (int i = 0; i < argc; i++)
    {
        if (i==0){
            snprintf(tmp_str, sizeof(tmp_str), "%s   ", argv[i]);
        }
        else if (i == 1){
            snprintf(tmp_str, sizeof(tmp_str), "%s     ", argv[i]);   
        }
        else if (i == 2){
            snprintf(tmp_str, sizeof(tmp_str), "%s", argv[i]);   
        }
        strcat(query_result_g, tmp_str);

    }
    
    strcat(query_result_g, "\n");
        

    return 0;
}